

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall QUrlModel::layoutChanged(QUrlModel *this)

{
  iterator path;
  iterator iVar1;
  long lVar2;
  WatchItem *item;
  WatchItem *pWVar3;
  long in_FS_OFFSET;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_98;
  QArrayDataPointer<char16_t> local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QAbstractItemModel *local_68;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_58,(this->watching).d.size);
  pWVar3 = (this->watching).d.ptr;
  for (lVar2 = (this->watching).d.size * 0x30; lVar2 != 0; lVar2 = lVar2 + -0x30) {
    QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_58,&pWVar3->path);
    pWVar3 = pWVar3 + 1;
  }
  QList<QUrlModel::WatchItem>::clear(&this->watching);
  path = QList<QString>::begin((QList<QString> *)&local_58);
  iVar1 = QList<QString>::end((QList<QString> *)&local_58);
  for (; path.i != iVar1.i; path.i = path.i + 1) {
    local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemModel::index((QString *)&local_78,(int)this->fileSystemModel);
    local_98.ptr = local_68;
    local_a8 = local_78;
    puStack_a0 = puStack_70;
    local_90.d = ((path.i)->d).d;
    local_90.ptr = ((path.i)->d).ptr;
    local_90.size = ((path.i)->d).size;
    if (local_90.d != (Data *)0x0) {
      LOCK();
      ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QList<QUrlModel::WatchItem>::emplaceBack<QUrlModel::WatchItem>
              (&this->watching,(WatchItem *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    if (((-1 < (int)local_78) && (-1 < (long)local_78)) && (local_68 != (QAbstractItemModel *)0x0))
    {
      changed(this,path.i);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::layoutChanged()
{
    QStringList paths;
    paths.reserve(watching.size());
    for (const WatchItem &item : std::as_const(watching))
        paths.append(item.path);
    watching.clear();
    for (const auto &path : paths) {
        QModelIndex newIndex = fileSystemModel->index(path);
        watching.append({newIndex, path});
        if (newIndex.isValid())
            changed(path);
     }
}